

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool testing::internal::
     MatchPrintAndExplain<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>const,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>const&>
               (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                *value,Matcher<const_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_&>
                       *matcher,MatchResultListener *listener)

{
  bool bVar1;
  ostream *poVar2;
  string local_220;
  string local_200;
  string *local_1e0;
  string *type_name;
  byte local_1c1;
  undefined1 local_1c0 [7];
  bool match;
  StringMatchResultListener inner_listener;
  MatchResultListener *listener_local;
  Matcher<const_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_&>
  *matcher_local;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *value_local;
  
  inner_listener._400_8_ = listener;
  bVar1 = MatchResultListener::IsInterested(listener);
  if (bVar1) {
    StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1c0);
    local_1c1 = MatcherBase<const_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_&>
                ::MatchAndExplain(&matcher->
                                   super_MatcherBase<const_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_&>
                                  ,value,(MatchResultListener *)local_1c0);
    poVar2 = MatchResultListener::stream((MatchResultListener *)inner_listener._400_8_);
    UniversalPrint<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
              (value,poVar2);
    GetTypeName<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>const>
              ();
    local_1e0 = &local_200;
    bVar1 = IsReadableTypeName(local_1e0);
    if (bVar1) {
      poVar2 = MatchResultListener::stream((MatchResultListener *)inner_listener._400_8_);
      poVar2 = std::operator<<(poVar2," (of type ");
      poVar2 = std::operator<<(poVar2,(string *)local_1e0);
      std::operator<<(poVar2,")");
    }
    StringMatchResultListener::str_abi_cxx11_(&local_220,(StringMatchResultListener *)local_1c0);
    poVar2 = MatchResultListener::stream((MatchResultListener *)inner_listener._400_8_);
    PrintIfNotEmpty(&local_220,poVar2);
    std::__cxx11::string::~string((string *)&local_220);
    value_local._7_1_ = (bool)(local_1c1 & 1);
    std::__cxx11::string::~string((string *)&local_200);
    StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1c0);
  }
  else {
    value_local._7_1_ =
         MatcherBase<const_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_&>
         ::Matches(&matcher->
                    super_MatcherBase<const_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_&>
                   ,value);
  }
  return value_local._7_1_;
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const std::string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}